

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_FailWillCrashIfEnabled_Test::~TEST_MockSupport_c_FailWillCrashIfEnabled_Test
          (TEST_MockSupport_c_FailWillCrashIfEnabled_Test *this)

{
  TEST_MockSupport_c_FailWillCrashIfEnabled_Test *this_local;
  
  ~TEST_MockSupport_c_FailWillCrashIfEnabled_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockSupport_c, FailWillCrashIfEnabled)
{
    cpputestHasCrashed = false;
    TestTestingFixture fixture;
    UtestShell::setCrashOnFail();
    UtestShell::setCrashMethod(crashMethod);

    fixture.setTestFunction(failedCallToMockC);

    fixture.runAllTests();

    CHECK(cpputestHasCrashed);
    LONGS_EQUAL(1, fixture.getFailureCount());

    UtestShell::restoreDefaultTestTerminator();
    UtestShell::resetCrashMethod();
}